

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O1

void math::internal::matrix_svd_clear_super_entry<double>
               (int rows,int cols,double *mat_b,double *mat_q,int row_index,double *epsilon)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  if (row_index + 1 < cols) {
    iVar6 = row_index * cols;
    lVar7 = (long)row_index + 1;
    lVar8 = (long)cols;
    pdVar9 = mat_b + lVar7 * lVar8;
    lVar5 = 8;
    do {
      dVar11 = mat_b[iVar6 + lVar7];
      if ((0.0 - *epsilon <= dVar11) && (dVar11 <= *epsilon)) {
        mat_b[iVar6 + lVar7] = 0.0;
        return;
      }
      iVar3 = (cols + 1) * (int)lVar7;
      dVar11 = dVar11 * dVar11 + mat_b[iVar3] * mat_b[iVar3];
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      uVar10 = -(ulong)(mat_b[iVar3] < 0.0);
      dVar11 = (double)(~uVar10 & (ulong)dVar11 | (ulong)-dVar11 & uVar10);
      dVar12 = mat_b[iVar3] / dVar11;
      dVar11 = mat_b[iVar6 + lVar7] / dVar11;
      if (0 < cols) {
        uVar10 = 0;
        do {
          dVar1 = mat_b[(long)iVar6 + uVar10];
          dVar2 = pdVar9[uVar10];
          mat_b[(long)iVar6 + uVar10] = dVar12 * dVar1 + dVar2 * -dVar11;
          pdVar9[uVar10] = dVar1 * dVar11 + dVar2 * dVar12;
          uVar10 = uVar10 + 1;
        } while ((uint)cols != uVar10);
      }
      if (0 < rows) {
        pdVar4 = mat_q + row_index;
        uVar10 = (ulong)(uint)rows;
        do {
          dVar1 = *pdVar4;
          dVar2 = *(double *)((long)pdVar4 + lVar5);
          *pdVar4 = dVar12 * dVar1 + dVar2 * -dVar11;
          *(double *)((long)pdVar4 + lVar5) = dVar1 * dVar11 + dVar2 * dVar12;
          pdVar4 = pdVar4 + lVar8;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      lVar7 = lVar7 + 1;
      pdVar9 = pdVar9 + lVar8;
      lVar5 = lVar5 + 8;
    } while ((int)lVar7 != cols);
  }
  return;
}

Assistant:

void
matrix_svd_clear_super_entry(int rows, int cols, T* mat_b, T* mat_q,
    int row_index, T const& epsilon)
{
    for (int i = row_index + 1; i < cols; ++i)
    {
        if (MATH_EPSILON_EQ(mat_b[row_index * cols + i], T(0), epsilon))
        {
            mat_b[row_index * cols + i] = T(0);
            break;
        }

        T norm = MATH_POW2(mat_b[row_index * cols + i])
            + MATH_POW2(mat_b[i * cols + i]);
        norm = std::sqrt(norm) * MATH_SIGN(mat_b[i * cols + i]);

        T givens_c = mat_b[i * cols + i] / norm;
        T givens_s = mat_b[row_index * cols + i] / norm;
        matrix_apply_givens_row(mat_b, cols, cols, row_index,
            i, givens_c, givens_s);
        matrix_apply_givens_column(mat_q, rows, cols, row_index,
            i, givens_c, givens_s);
    }
}